

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseDispatch<QVariant>::
     call<QtPromise::QPromiseResolve<QVariant>,QtPromise::QPromiseReject<QVariant>,std::function<QVariant(int_const&)>,int_const&>
               (QPromiseResolve<QVariant> *resolve,QPromiseReject<QVariant> *reject,
               function<QVariant_(const_int_&)> *fn,int *args)

{
  undefined8 uVar1;
  anon_union_24_3_e3d07ef4_for_data local_30;
  
  if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar1 = std::__throw_bad_function_call();
    QVariant::~QVariant((QVariant *)&local_30);
    __cxa_begin_catch(uVar1);
    std::current_exception();
    PromiseResolver<QVariant>::reject<std::__exception_ptr::exception_ptr>
              (&reject->m_resolver,(exception_ptr *)&local_30.shared);
    if (local_30.shared != (PrivateShared *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    __cxa_end_catch();
  }
  else {
    (*fn->_M_invoker)((QVariant *)&local_30,(_Any_data *)fn,args);
    PromiseResolver<QVariant>::resolve<QVariant>(&resolve->m_resolver,(QVariant *)&local_30);
    QVariant::~QVariant((QVariant *)&local_30);
  }
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }